

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesPowerSetEnergyThreshold(zes_pwr_handle_t hPower,double threshold)

{
  zes_pfnPowerSetEnergyThreshold_t pfnSetEnergyThreshold;
  dditable_t *dditable;
  ze_result_t result;
  double threshold_local;
  zes_pwr_handle_t hPower_local;
  
  if (*(code **)(*(long *)(hPower + 8) + 0xac0) == (code *)0x0) {
    hPower_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPower_local._4_4_ =
         (**(code **)(*(long *)(hPower + 8) + 0xac0))(threshold,*(undefined8 *)hPower);
  }
  return hPower_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerSetEnergyThreshold(
        zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
        double threshold                                ///< [in] The energy threshold to be set in joules.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_pwr_object_t*>( hPower )->dditable;
        auto pfnSetEnergyThreshold = dditable->zes.Power.pfnSetEnergyThreshold;
        if( nullptr == pfnSetEnergyThreshold )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPower = reinterpret_cast<zes_pwr_object_t*>( hPower )->handle;

        // forward to device-driver
        result = pfnSetEnergyThreshold( hPower, threshold );

        return result;
    }